

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

void putRGBseparate16bittile
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *r,uchar *g,uchar *b,uchar *a)

{
  uint8_t *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (h != 0) {
    lVar2 = (long)fromskew;
    do {
      if (w != 0) {
        puVar1 = img->Bitdepth16To8;
        lVar4 = 0;
        lVar5 = 0;
        lVar3 = 0;
        do {
          cp[lVar3] = CONCAT12(puVar1[*(ushort *)(b + lVar3 * 2)],
                               CONCAT11(puVar1[*(ushort *)(g + lVar3 * 2)],
                                        puVar1[*(ushort *)(r + lVar3 * 2)])) | 0xff000000;
          lVar3 = lVar3 + 1;
          lVar5 = lVar5 + -2;
          lVar4 = lVar4 + -4;
        } while (w != (uint32_t)lVar3);
        b = b + -lVar5;
        g = g + -lVar5;
        r = r + -lVar5;
        cp = (uint32_t *)((long)cp - lVar4);
      }
      r = r + lVar2 * 2;
      g = g + lVar2 * 2;
      b = b + lVar2 * 2;
      cp = cp + toskew;
      h = h - 1;
    } while (h != 0);
  }
  return;
}

Assistant:

DECLARESepPutFunc(putRGBseparate16bittile)
{
    uint16_t *wr = (uint16_t *)r;
    uint16_t *wg = (uint16_t *)g;
    uint16_t *wb = (uint16_t *)b;
    (void)img;
    (void)y;
    (void)a;
    for (; h > 0; --h)
    {
        for (x = 0; x < w; x++)
            *cp++ = PACK(img->Bitdepth16To8[*wr++], img->Bitdepth16To8[*wg++],
                         img->Bitdepth16To8[*wb++]);
        SKEW(wr, wg, wb, fromskew);
        cp += toskew;
    }
}